

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

bool __thiscall FButtonStatus::PressKey(FButtonStatus *this,int keynum)

{
  BYTE BVar1;
  uint uVar2;
  int local_24;
  int iStack_20;
  BYTE wasdown;
  int open;
  int i;
  int keynum_local;
  FButtonStatus *this_local;
  
  uVar2 = keynum & 0x7fff;
  if (uVar2 == 0) {
    this->Keys[0] = 0xffff;
    for (iStack_20 = 5; 0 < iStack_20; iStack_20 = iStack_20 + -1) {
      this->Keys[iStack_20] = 0;
    }
  }
  else {
    local_24 = -1;
    for (iStack_20 = 5; -1 < iStack_20; iStack_20 = iStack_20 + -1) {
      if (this->Keys[iStack_20] == 0) {
        local_24 = iStack_20;
      }
      else if (this->Keys[iStack_20] == uVar2) {
        return false;
      }
    }
    if (local_24 < 0) {
      Printf("More than %u keys pressed for a single action!\n",6);
      return false;
    }
    this->Keys[local_24] = (WORD)uVar2;
  }
  BVar1 = this->bDown;
  this->bWentDown = '\x01';
  this->bDown = '\x01';
  return BVar1 == '\0';
}

Assistant:

bool FButtonStatus::PressKey (int keynum)
{
	int i, open;

	keynum &= KEY_DBLCLICKED-1;

	if (keynum == 0)
	{ // Issued from console instead of a key, so force on
		Keys[0] = 0xffff;
		for (i = MAX_KEYS-1; i > 0; --i)
		{
			Keys[i] = 0;
		}
	}
	else
	{
		for (i = MAX_KEYS-1, open = -1; i >= 0; --i)
		{
			if (Keys[i] == 0)
			{
				open = i;
			}
			else if (Keys[i] == keynum)
			{ // Key is already down; do nothing
				return false;
			}
		}
		if (open < 0)
		{ // No free key slots, so do nothing
			Printf ("More than %u keys pressed for a single action!\n", MAX_KEYS);
			return false;
		}
		Keys[open] = keynum;
	}
	BYTE wasdown = bDown;
	bDown = bWentDown = true;
	// Returns true if this key caused the button to go down.
	return !wasdown;
}